

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::anon_unknown_1::PosixColourImpl::use(PosixColourImpl *this,Code _colourCode)

{
  string *msg;
  undefined4 in_ESI;
  ReusableStringStream *in_stack_fffffffffffffee8;
  ReusableStringStream *in_stack_fffffffffffffef0;
  string *in_stack_ffffffffffffff10;
  ReusableStringStream *in_stack_ffffffffffffff20;
  SourceLineInfo local_b0 [5];
  SourceLineInfo local_58 [5];
  
  switch(in_ESI) {
  case 0:
  case 1:
    setColour((PosixColourImpl *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    break;
  case 2:
    setColour((PosixColourImpl *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    break;
  case 3:
    setColour((PosixColourImpl *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    break;
  case 4:
    setColour((PosixColourImpl *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    break;
  case 5:
    setColour((PosixColourImpl *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    break;
  case 6:
    setColour((PosixColourImpl *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    break;
  case 7:
    setColour((PosixColourImpl *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    break;
  default:
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff20);
    SourceLineInfo::SourceLineInfo
              (local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
               ,0x27db);
    msg = (string *)
          ReusableStringStream::operator<<
                    (in_stack_fffffffffffffef0,(SourceLineInfo *)in_stack_fffffffffffffee8);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffef0,(char (*) [26])in_stack_fffffffffffffee8);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffef0,(char (*) [25])in_stack_fffffffffffffee8);
    ReusableStringStream::str_abi_cxx11_(in_stack_fffffffffffffee8);
    throw_logic_error(msg);
  case 0x10:
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff20);
    SourceLineInfo::SourceLineInfo
              (local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
               ,0x27da);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffef0,(SourceLineInfo *)in_stack_fffffffffffffee8);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffef0,(char (*) [26])in_stack_fffffffffffffee8);
    ReusableStringStream::operator<<
              (in_stack_fffffffffffffef0,(char (*) [13])in_stack_fffffffffffffee8);
    ReusableStringStream::str_abi_cxx11_(in_stack_fffffffffffffee8);
    throw_logic_error(in_stack_ffffffffffffff10);
  case 0x11:
    setColour((PosixColourImpl *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    break;
  case 0x12:
    setColour((PosixColourImpl *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    break;
  case 0x13:
    setColour((PosixColourImpl *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    break;
  case 0x16:
    setColour((PosixColourImpl *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    break;
  case 0x17:
    setColour((PosixColourImpl *)in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  }
  return;
}

Assistant:

void use( Colour::Code _colourCode ) override {
            switch( _colourCode ) {
                case Colour::None:
                case Colour::White:     return setColour( "[0m" );
                case Colour::Red:       return setColour( "[0;31m" );
                case Colour::Green:     return setColour( "[0;32m" );
                case Colour::Blue:      return setColour( "[0;34m" );
                case Colour::Cyan:      return setColour( "[0;36m" );
                case Colour::Yellow:    return setColour( "[0;33m" );
                case Colour::Grey:      return setColour( "[1;30m" );

                case Colour::LightGrey:     return setColour( "[0;37m" );
                case Colour::BrightRed:     return setColour( "[1;31m" );
                case Colour::BrightGreen:   return setColour( "[1;32m" );
                case Colour::BrightWhite:   return setColour( "[1;37m" );
                case Colour::BrightYellow:  return setColour( "[1;33m" );

                case Colour::Bright: CATCH_INTERNAL_ERROR( "not a colour" );
                default: CATCH_INTERNAL_ERROR( "Unknown colour requested" );
            }
        }